

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::HierarchicalValueExpression>
          (EffectiveWidthVisitor *this,HierarchicalValueExpression *expr)

{
  bool bVar1;
  HierarchicalValueExpression *expr_local;
  EffectiveWidthVisitor *this_local;
  
  bVar1 = slang::ast::Expression::bad((Expression *)expr);
  if (bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
  }
  else {
    this_local = (EffectiveWidthVisitor *)
                 slang::ast::ValueExpressionBase::getEffectiveWidthImpl
                           (&expr->super_ValueExpressionBase);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<bitwidth_t> visit(const T& expr) {
        if constexpr (is_detected_v<getEffectiveWidth_t, T>) {
            if (expr.bad())
                return std::nullopt;

            return expr.getEffectiveWidthImpl();
        }
        else {
            return expr.type->getBitWidth();
        }
    }